

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_queue_tail_multiple.h
# Opt level: O1

ControlBlock * __thiscall
density::detail::
SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
::get_or_allocate_next_page
          (SpQueue_TailMultiple<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
           *this,LfQueue_ProgressGuarantee i_progress_guarantee,ControlBlock *i_end_control)

{
  ControlBlock *pCVar1;
  
  if ((i_end_control == (ControlBlock *)0x0) ||
     ((ControlBlock *)((ulong)i_end_control | 0xffc0) != i_end_control ||
      ((ulong)i_end_control & 0x3f) != 0)) {
    density_tests::detail::assert_failed<>
              ("i_end_control != nullptr && address_is_aligned(i_end_control, s_alloc_granularity) && i_end_control == get_end_control_block(i_end_control)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/sp_queue_tail_multiple.h"
               ,0x156);
  }
  if (i_end_control != (ControlBlock *)0xffc0) {
    pCVar1 = create_page(this,i_progress_guarantee);
    if (pCVar1 == (ControlBlock *)0x0) {
      pCVar1 = (ControlBlock *)0x0;
    }
    else {
      LOCK();
      i_end_control->m_next = (uintptr_t)((long)&pCVar1->m_next + 2);
      UNLOCK();
      this->m_tail = pCVar1;
    }
    return pCVar1;
  }
  pCVar1 = create_initial_page(this,i_progress_guarantee);
  return pCVar1;
}

Assistant:

ControlBlock * get_or_allocate_next_page(
              LfQueue_ProgressGuarantee i_progress_guarantee, ControlBlock * const i_end_control)
            {
                DENSITY_ASSERT_INTERNAL(
                  i_end_control != nullptr &&
                  address_is_aligned(i_end_control, s_alloc_granularity) &&
                  i_end_control == get_end_control_block(i_end_control));

                if (i_end_control != invalid_control_block())
                {
                    // allocate and setup a new page
                    auto new_page = create_page(i_progress_guarantee);
                    if (new_page == nullptr)
                    {
                        return nullptr;
                    }

                    raw_atomic_store(
                      &i_end_control->m_next, reinterpret_cast<uintptr_t>(new_page) + LfQueue_Dead);

                    m_tail = new_page;

                    return m_tail;
                }
                else
                {
                    return create_initial_page(i_progress_guarantee);
                }
            }